

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

size_t mbedtls_ssl_get_output_max_frag_len(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  
  bVar2 = ssl->conf->mfl_code - 1;
  uVar1 = 0x400;
  if (bVar2 < 4) {
    uVar1 = *(uint *)(&DAT_0023fbe0 + (ulong)bVar2 * 4);
  }
  if (ssl->session_out != (mbedtls_ssl_session *)0x0) {
    bVar2 = ssl->session_out->mfl_code - 1;
    uVar3 = 0x400;
    if (bVar2 < 4) {
      uVar3 = *(uint *)(&DAT_0023fbe0 + (ulong)bVar2 * 4);
    }
    if ((uVar3 < uVar1) && (uVar1 = 0x400, bVar2 < 4)) {
      uVar1 = *(uint *)(&DAT_0023fbe0 + (ulong)bVar2 * 4);
    }
  }
  if (ssl->session_negotiate != (mbedtls_ssl_session *)0x0) {
    bVar2 = ssl->session_negotiate->mfl_code - 1;
    uVar3 = 0x400;
    if (bVar2 < 4) {
      uVar3 = *(uint *)(&DAT_0023fbe0 + (ulong)bVar2 * 4);
    }
    if ((uVar3 < uVar1) && (uVar1 = 0x400, bVar2 < 4)) {
      uVar1 = *(uint *)(&DAT_0023fbe0 + (ulong)bVar2 * 4);
    }
  }
  return (ulong)uVar1;
}

Assistant:

size_t mbedtls_ssl_get_output_max_frag_len(const mbedtls_ssl_context *ssl)
{
    size_t max_len;

    /*
     * Assume mfl_code is correct since it was checked when set
     */
    max_len = ssl_mfl_code_to_length(ssl->conf->mfl_code);

    /* Check if a smaller max length was negotiated */
    if (ssl->session_out != NULL &&
        ssl_mfl_code_to_length(ssl->session_out->mfl_code) < max_len) {
        max_len = ssl_mfl_code_to_length(ssl->session_out->mfl_code);
    }

    /* During a handshake, use the value being negotiated */
    if (ssl->session_negotiate != NULL &&
        ssl_mfl_code_to_length(ssl->session_negotiate->mfl_code) < max_len) {
        max_len = ssl_mfl_code_to_length(ssl->session_negotiate->mfl_code);
    }

    return max_len;
}